

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_astMessageSendNode_primitiveAnalyze
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t *receiverType;
  ulong *function;
  _Bool _Var1;
  uint uVar2;
  sysbvm_tuple_t sVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  undefined8 uVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  bool bVar11;
  anon_struct_160_20_88b2b351 gcFrame;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_tuple_t local_128;
  sysbvm_tuple_t local_120;
  sysbvm_tuple_t local_118;
  sysbvm_tuple_t local_110;
  sysbvm_tuple_t local_108;
  sysbvm_tuple_t *local_100;
  sysbvm_tuple_t local_f8;
  sysbvm_tuple_t *local_f0;
  sysbvm_tuple_t local_e8;
  ulong *local_e0;
  sysbvm_tuple_t *local_d8;
  sysbvm_tuple_t local_d0;
  sysbvm_tuple_t local_c8;
  sysbvm_tuple_t local_c0;
  sysbvm_tuple_t local_b8;
  sysbvm_tuple_t local_b0;
  sysbvm_tuple_t local_a8;
  sysbvm_tuple_t local_a0;
  sysbvm_tuple_t *local_98;
  sysbvm_tuple_t local_90;
  sysbvm_stackFrameRecord_t local_88;
  undefined8 local_78;
  undefined1 *local_70;
  sysbvm_stackFrameRecord_t local_60;
  undefined8 local_50;
  sysbvm_tuple_t *local_48;
  sysbvm_tuple_t local_40;
  sysbvm_tuple_t local_38;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  memset(&local_128,0,0xa0);
  local_88.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_88.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_88._12_4_ = 0;
  local_78 = 0x14;
  local_70 = (undefined1 *)&local_128;
  sysbvm_stackFrame_pushRecord(&local_88);
  local_128 = sysbvm_context_shallowCopy(context,*arguments);
  sVar3 = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context,arguments[1]);
  *(sysbvm_tuple_t *)(local_128 + 0x18) = sVar3;
  local_60.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_60.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  local_50 = *(undefined8 *)(local_128 + 0x10);
  sysbvm_stackFrame_pushRecord(&local_60);
  if (*(sysbvm_tuple_t *)(local_128 + 0x28) == 0) {
    local_110 = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                          (context,*(sysbvm_tuple_t *)(local_128 + 0x38),(context->roots).symbolType
                           ,arguments[1]);
    *(sysbvm_tuple_t *)(local_128 + 0x38) = local_110;
  }
  else {
    local_120 = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                          (context,*(sysbvm_tuple_t *)(local_128 + 0x28),
                           (context->roots).directTypeInferenceType,arguments[1]);
    *(sysbvm_tuple_t *)(local_128 + 0x28) = local_120;
    if ((local_120 & 0xf) == 0 && local_120 != 0) {
      local_100 = *(sysbvm_tuple_t **)(local_120 + 0x20);
    }
    else {
      local_100 = (sysbvm_tuple_t *)0x0;
    }
    _Var1 = sysbvm_astNode_isTupleWithLookupStartingFromNode(context,local_120);
    if (_Var1) {
      sVar3 = *(sysbvm_tuple_t *)(local_120 + 0x28);
      *(sysbvm_tuple_t *)(local_128 + 0x28) = sVar3;
      local_118 = *(sysbvm_tuple_t *)(local_120 + 0x30);
      local_120 = sVar3;
LAB_00125f5a:
      *(sysbvm_tuple_t *)(local_128 + 0x30) = local_118;
    }
    else if (*(sysbvm_tuple_t *)(local_128 + 0x30) != 0) {
      local_118 = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                            (context,*(sysbvm_tuple_t *)(local_128 + 0x30),(context->roots).typeType
                             ,arguments[1]);
      goto LAB_00125f5a;
    }
    if (local_100 == (sysbvm_tuple_t *)0x0) {
      local_110 = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                            (context,*(sysbvm_tuple_t *)(local_128 + 0x38),
                             (context->roots).symbolType,arguments[1]);
      *(sysbvm_tuple_t *)(local_128 + 0x38) = local_110;
      _Var1 = sysbvm_astNode_isLiteralNode(context,local_110);
      if (_Var1) {
        local_e8 = sysbvm_astLiteralNode_getValue(*(sysbvm_tuple_t *)(local_128 + 0x38));
        local_e0 = (ulong *)sysbvm_type_lookupMacroSelector
                                      (context,(context->roots).anyValueType,local_e8);
      }
    }
    else {
      uVar8 = (ulong)((uint)local_100 & 0xf);
      if (uVar8 == 0xf) {
        local_f8 = sysbvm_tuple_getImmediateTrivialTypeWithIndex(context,(ulong)local_100 >> 4);
      }
      else if (uVar8 == 0) {
        local_f8 = *local_100;
      }
      else {
        local_f8 = sysbvm_tuple_getImmediateTypeWithTag(context,uVar8);
      }
      local_d0 = sysbvm_type_getAnalyzeMessageSendNodeWithEnvironmentFunction(context,local_f8);
      if ((local_d0 != 0) &&
         (_Var1 = sysbvm_astNode_isLiteralNode(context,*(sysbvm_tuple_t *)(local_128 + 0x28)), _Var1
         )) {
        local_38 = arguments[1];
        local_48 = local_100;
        local_40 = local_128;
        local_c8 = sysbvm_function_apply(context,local_d0,3,(sysbvm_tuple_t *)&local_48,0);
        sysbvm_stackFrame_popRecord(&local_60);
        sysbvm_stackFrame_popRecord(&local_88);
        return local_c8;
      }
      local_110 = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                            (context,*(sysbvm_tuple_t *)(local_128 + 0x38),
                             (context->roots).symbolType,arguments[1]);
      *(sysbvm_tuple_t *)(local_128 + 0x38) = local_110;
      _Var1 = sysbvm_astNode_isLiteralNode(context,local_110);
      if (_Var1) {
        local_e8 = sysbvm_astLiteralNode_getValue(*(sysbvm_tuple_t *)(local_128 + 0x38));
        local_f0 = local_100;
        local_e0 = (ulong *)sysbvm_type_lookupMacroSelector
                                      (context,(sysbvm_tuple_t)local_100,local_e8);
        if (((local_e0 == (ulong *)0x0) &&
            (local_e0 = (ulong *)sysbvm_type_lookupSelector
                                           (context,(sysbvm_tuple_t)local_100,local_e8),
            local_e0 == (ulong *)0x0)) &&
           (local_e0 = (ulong *)sysbvm_type_lookupFallbackSelector
                                          (context,(sysbvm_tuple_t)local_100,local_e8),
           local_e0 == (ulong *)0x0)) {
          if ((((ulong)local_100 & 0xf) == 0 && local_100 != (sysbvm_tuple_t *)0x0) &&
             ((local_100[1] & 0x80) == 0)) {
            uVar8 = local_100[0xe];
            if (uVar8 == 0 || (uVar8 & 0xf) != 0) {
              uVar2 = (uint)((long)uVar8 >> 4);
            }
            else {
              uVar2 = (uint)*(undefined8 *)(uVar8 + 0x10);
            }
            if ((uVar2 >> 10 & 1) != 0) {
              local_f0 = (sysbvm_tuple_t *)sysbvm_type_decay(context,(sysbvm_tuple_t)local_100);
              local_e0 = (ulong *)sysbvm_type_lookupMacroSelector
                                            (context,(sysbvm_tuple_t)local_f0,local_e8);
              if (((local_e0 != (ulong *)0x0) ||
                  (local_e0 = (ulong *)sysbvm_type_lookupSelector
                                                 (context,(sysbvm_tuple_t)local_f0,local_e8),
                  local_e0 != (ulong *)0x0)) ||
                 (local_e0 = (ulong *)sysbvm_type_lookupFallbackSelector
                                                (context,(sysbvm_tuple_t)local_f0,local_e8),
                 local_e0 != (ulong *)0x0)) goto LAB_001262db;
            }
          }
          local_e0 = (ulong *)0x0;
          local_f0 = local_100;
          local_e0 = (ulong *)sysbvm_type_lookupMacroSelector
                                        (context,(sysbvm_tuple_t)local_100,
                                         (context->roots).doesNotUnderstandSelector);
          if ((local_e0 == (ulong *)0x0) &&
             (local_e0 = (ulong *)sysbvm_type_lookupSelector
                                            (context,(sysbvm_tuple_t)local_100,
                                             (context->roots).doesNotUnderstandSelector),
             local_e0 == (ulong *)0x0)) {
            local_e0 = (ulong *)sysbvm_type_lookupFallbackSelector
                                          (context,(sysbvm_tuple_t)local_100,
                                           (context->roots).doesNotUnderstandSelector);
          }
          if (((((ulong)local_e0 & 0xf) == 0 && local_e0 != (ulong *)0x0) &&
              (uVar8 = *local_e0, (uVar8 & 0xf) == 0 && uVar8 != 0)) &&
             ((*(byte *)(uVar8 + 8) & 0x80) == 0)) {
            uVar8 = *(ulong *)(uVar8 + 0x70);
            bVar10 = (uVar8 & 0xf) == 0;
            uVar6 = (uint)((long)uVar8 >> 4);
            uVar2 = uVar6;
            if (uVar8 != 0 && bVar10) {
              uVar2 = (uint)*(undefined8 *)(uVar8 + 0x10);
            }
            if ((uVar2 >> 0xc & 1) != 0) {
              uVar4 = local_e0[5];
              bVar11 = (uVar4 & 0xf) == 0;
              uVar5 = (long)uVar4 >> 4;
              uVar9 = uVar5;
              if (uVar4 != 0 && bVar11) {
                uVar9 = *(ulong *)(uVar4 + 0x10);
              }
              if ((uVar9 & 1) != 0) {
                if (uVar8 != 0 && bVar10) {
                  uVar6 = (uint)*(undefined8 *)(uVar8 + 0x10);
                }
                if ((uVar6 >> 0xc & 1) != 0) {
                  if (uVar4 != 0 && bVar11) {
                    uVar5 = *(ulong *)(uVar4 + 0x10);
                  }
                  if ((uVar5 & 1) != 0) {
                    local_98 = (sysbvm_tuple_t *)
                               sysbvm_macroContext_create
                                         (context,*arguments,*(sysbvm_tuple_t *)(local_128 + 0x10),
                                          arguments[1]);
                    local_40 = *(undefined8 *)(local_128 + 0x28);
                    local_38 = local_128;
                    local_48 = local_98;
                    local_90 = sysbvm_function_apply
                                         (context,(sysbvm_tuple_t)local_e0,3,
                                          (sysbvm_tuple_t *)&local_48,0);
                    sysbvm_stackFrame_popRecord(&local_60);
                    sysbvm_stackFrame_popRecord(&local_88);
                    sVar3 = local_90;
                    goto LAB_00126410;
                  }
                }
                goto LAB_001262db;
              }
            }
          }
          local_e0 = (ulong *)0x0;
        }
      }
    }
  }
LAB_001262db:
  _Var1 = sysbvm_astNode_isLiteralNode(context,*(sysbvm_tuple_t *)(local_128 + 0x30));
  function = local_e0;
  receiverType = local_f0;
  if (local_e0 != (ulong *)0x0) {
    if (!_Var1) {
      _Var1 = sysbvm_astNode_isLiteralNode(context,*(sysbvm_tuple_t *)(local_128 + 0x28));
      _Var1 = sysbvm_function_shouldOptimizeLookup
                        (context,(sysbvm_tuple_t)function,(sysbvm_tuple_t)receiverType,_Var1);
      if (!_Var1) {
        if (local_e0 != (ulong *)0x0) {
          *(ulong **)(local_128 + 0x50) = local_e0;
          *(sysbvm_tuple_t **)(local_128 + 0x58) = local_f0;
          uVar8 = (ulong)((uint)local_e0 & 0xf);
          if (uVar8 == 0xf) {
            local_d8 = (sysbvm_tuple_t *)
                       sysbvm_tuple_getImmediateTrivialTypeWithIndex(context,(ulong)local_e0 >> 4);
          }
          else if (uVar8 == 0) {
            local_d8 = (sysbvm_tuple_t *)*local_e0;
          }
          else {
            local_d8 = (sysbvm_tuple_t *)sysbvm_tuple_getImmediateTypeWithTag(context,uVar8);
          }
          uVar8 = (ulong)local_d8 & 0xf;
          if (uVar8 == 0 && local_d8 != (sysbvm_tuple_t *)0x0) {
            sVar3 = *local_d8;
          }
          else if ((int)uVar8 == 0xf) {
            sVar3 = sysbvm_tuple_getImmediateTrivialTypeWithIndex(context,(ulong)local_d8 >> 4);
          }
          else {
            sVar3 = sysbvm_tuple_getImmediateTypeWithTag(context,uVar8);
          }
          local_d0 = sysbvm_type_getAnalyzeAndTypeCheckMessageSendNodeWithEnvironment(context,sVar3)
          ;
          if (local_d0 != 0) {
            sysbvm_stackFrame_popRecord(&local_88);
            local_38 = arguments[1];
            local_48 = local_d8;
            local_40 = local_128;
            sVar3 = sysbvm_function_apply(context,local_d0,3,(sysbvm_tuple_t *)&local_48,0);
            return sVar3;
          }
          goto LAB_00126572;
        }
        goto LAB_00126451;
      }
    }
    uVar8 = *(ulong *)(local_128 + 0x40);
    if ((uVar8 & 0xf) == 0 && uVar8 != 0) {
      uVar8 = (ulong)(*(uint *)(uVar8 + 0xc) >> 3);
    }
    else {
      uVar8 = 0;
    }
    local_c0 = sysbvm_astLiteralNode_create
                         (context,*(sysbvm_tuple_t *)(local_128 + 0x10),(sysbvm_tuple_t)local_e0);
    local_b8 = sysbvm_array_create(context,uVar8 + 1);
    if ((local_b8 & 0xf) == 0 && local_b8 != 0) {
      *(undefined8 *)(local_b8 + 0x10) = *(undefined8 *)(local_128 + 0x28);
    }
    if (uVar8 != 0) {
      uVar4 = 0;
      do {
        uVar5 = *(ulong *)(local_128 + 0x40);
        if ((uVar5 & 0xf) == 0 && uVar5 != 0) {
          uVar7 = *(undefined8 *)(uVar5 + 0x10 + uVar4 * 8);
        }
        else {
          uVar7 = 0;
        }
        if ((local_b8 & 0xf) == 0 && local_b8 != 0) {
          *(undefined8 *)(local_b8 + 0x18 + uVar4 * 8) = uVar7;
        }
        uVar4 = uVar4 + 1;
      } while (uVar8 != uVar4);
    }
    local_b0 = sysbvm_astUnexpandedApplicationNode_create
                         (context,*(sysbvm_tuple_t *)(local_128 + 0x10),local_c0,local_b8);
    sysbvm_stackFrame_popRecord(&local_88);
    sVar3 = local_b0;
LAB_00126410:
    sVar3 = sysbvm_interpreter_analyzeASTWithCurrentExpectedTypeWithEnvironment
                      (context,sVar3,arguments[1]);
    return sVar3;
  }
LAB_00126451:
  if ((*(long *)(local_128 + 0x48) != 0x1f) &&
     (sVar3 = sysbvm_type_decay(context,(sysbvm_tuple_t)local_100), sVar3 != 0)) {
    if ((sVar3 & 0xf) != 0) {
LAB_0012647a:
      sysbvm_error("Cannot send undeclared message to receiver without a dynamic type.");
    }
    if ((*(byte *)(sVar3 + 8) & 0x80) == 0) {
      uVar8 = *(ulong *)(sVar3 + 0x70);
      if (uVar8 == 0 || (uVar8 & 0xf) != 0) {
        uVar8 = (long)uVar8 >> 4;
      }
      else {
        uVar8 = *(ulong *)(uVar8 + 0x10);
      }
      if ((uVar8 & 0x40) == 0) goto LAB_0012647a;
    }
  }
LAB_00126572:
  local_120 = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                        (context,local_120,0,arguments[1]);
  *(sysbvm_tuple_t *)(local_128 + 0x28) = local_120;
  uVar8 = *(ulong *)(local_128 + 0x40);
  if (uVar8 == 0 || (uVar8 & 0xf) != 0) {
    local_108 = sysbvm_array_create(context,0);
  }
  else {
    uVar2 = *(uint *)(uVar8 + 0xc);
    uVar8 = (ulong)(uVar2 >> 3);
    local_108 = sysbvm_array_create(context,uVar8);
    if (7 < uVar2) {
      uVar4 = 0;
      do {
        uVar5 = *(ulong *)(local_128 + 0x40);
        if ((uVar5 & 0xf) == 0 && uVar5 != 0) {
          local_a8 = *(sysbvm_tuple_t *)(uVar5 + 0x10 + uVar4 * 8);
        }
        else {
          local_a8 = 0;
        }
        local_a0 = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                             (context,local_a8,0,arguments[1]);
        if ((local_108 & 0xf) == 0 && local_108 != 0) {
          *(sysbvm_tuple_t *)(local_108 + 0x10 + uVar4 * 8) = local_a0;
        }
        uVar4 = uVar4 + 1;
      } while (uVar8 != uVar4);
    }
  }
  *(sysbvm_tuple_t *)(local_128 + 0x40) = local_108;
  *(sysbvm_tuple_t *)(local_128 + 0x20) = (context->roots).anyValueType;
  sysbvm_stackFrame_popRecord(&local_60);
  sysbvm_stackFrame_popRecord(&local_88);
  return local_128;
}

Assistant:

static sysbvm_tuple_t sysbvm_astMessageSendNode_primitiveAnalyze(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    struct {
        sysbvm_astMessageSendNode_t *sendNode;
        sysbvm_tuple_t analyzedReceiver;
        sysbvm_tuple_t analyzedReceiverTypeExpression;
        sysbvm_tuple_t analyzedSelector;
        sysbvm_tuple_t analyzedArguments;

        sysbvm_tuple_t receiverType;
        sysbvm_tuple_t receiverMetaType;
        sysbvm_tuple_t methodOwner;
        sysbvm_tuple_t selector;
        sysbvm_tuple_t method;
        sysbvm_tuple_t methodType;
        sysbvm_tuple_t analysisFunction;
        sysbvm_tuple_t result;
        sysbvm_tuple_t newMethodNode;
        sysbvm_tuple_t newArgumentNodes;
        sysbvm_tuple_t unexpandedApplicationNode;

        sysbvm_tuple_t argumentNode;
        sysbvm_tuple_t analyzedArgumentNode;

        sysbvm_tuple_t macroContext;
        sysbvm_tuple_t expansionResult;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    gcFrame.sendNode = (sysbvm_astMessageSendNode_t*)sysbvm_context_shallowCopy(context, *node);
    gcFrame.sendNode->super.analyzerToken = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context, *environment);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, gcFrame.sendNode->super.sourcePosition);

    bool isDoesNotUnderstand = false;
    if(gcFrame.sendNode->receiver)
    {
        gcFrame.analyzedReceiver = sysbvm_interpreter_analyzeASTWithDirectTypeWithEnvironment(context, gcFrame.sendNode->receiver, *environment);
        gcFrame.sendNode->receiver = gcFrame.analyzedReceiver;
        gcFrame.receiverType = sysbvm_astNode_getAnalyzedType(gcFrame.analyzedReceiver);

        // Inline the object with lookup starting from node.
        if(sysbvm_astNode_isTupleWithLookupStartingFromNode(context, gcFrame.analyzedReceiver))
        {
            sysbvm_astTupleWithLookupStartingFromNode_t *objectLookup = (sysbvm_astTupleWithLookupStartingFromNode_t*)gcFrame.analyzedReceiver;
            gcFrame.analyzedReceiver = objectLookup->tupleExpression;
            gcFrame.sendNode->receiver = gcFrame.analyzedReceiver;
            
            gcFrame.analyzedReceiverTypeExpression = objectLookup->typeExpression;
            gcFrame.sendNode->receiverLookupType = gcFrame.analyzedReceiverTypeExpression;
            
        }
        else if(gcFrame.sendNode->receiverLookupType)
        {
            gcFrame.analyzedReceiverTypeExpression = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.sendNode->receiverLookupType, context->roots.typeType, *environment);
            gcFrame.sendNode->receiverLookupType = gcFrame.analyzedReceiverTypeExpression;
        }

        if(gcFrame.receiverType)
        {
            // If the receiver is a literal node, we can attempt to forward the message send node analysis.
            gcFrame.receiverMetaType = sysbvm_tuple_getType(context, gcFrame.receiverType);
            gcFrame.analysisFunction = sysbvm_type_getAnalyzeMessageSendNodeWithEnvironmentFunction(context, gcFrame.receiverMetaType);

            // HACK: Remove this literal check when properly implementing this.
            if(gcFrame.analysisFunction && sysbvm_astNode_isLiteralNode(context, gcFrame.sendNode->receiver))
            {
                gcFrame.result = sysbvm_function_apply3(context, gcFrame.analysisFunction, gcFrame.receiverType, (sysbvm_tuple_t)gcFrame.sendNode, *environment);
                SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
                SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
                return gcFrame.result;
            }

            // If the selector is a literal, attempt to perform a static lookup.
            gcFrame.analyzedSelector = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.sendNode->selector, context->roots.symbolType, *environment);
            gcFrame.sendNode->selector = gcFrame.analyzedSelector;
            if(sysbvm_astNode_isLiteralNode(context, gcFrame.sendNode->selector))
            {
                gcFrame.selector = sysbvm_astLiteralNode_getValue(gcFrame.sendNode->selector);
                gcFrame.methodOwner = gcFrame.receiverType;
                gcFrame.method = sysbvm_type_lookupMacroSelector(context, gcFrame.receiverType, gcFrame.selector);
                if(!gcFrame.method)
                    gcFrame.method = sysbvm_type_lookupSelector(context, gcFrame.receiverType, gcFrame.selector);
                if(!gcFrame.method)
                    gcFrame.method = sysbvm_type_lookupFallbackSelector(context, gcFrame.receiverType, gcFrame.selector);

                if(!gcFrame.method && sysbvm_type_isReferenceType(gcFrame.receiverType))
                {
                    gcFrame.methodOwner = sysbvm_type_decay(context, gcFrame.receiverType);
                    gcFrame.method = sysbvm_type_lookupMacroSelector(context, gcFrame.methodOwner, gcFrame.selector);
                    if(!gcFrame.method)
                        gcFrame.method = sysbvm_type_lookupSelector(context, gcFrame.methodOwner, gcFrame.selector);
                    if(!gcFrame.method)
                        gcFrame.method = sysbvm_type_lookupFallbackSelector(context, gcFrame.methodOwner, gcFrame.selector);
                }

                // does not understand macro?
                if(!gcFrame.method)
                {
                    gcFrame.methodOwner = gcFrame.receiverType;
                    if(!gcFrame.method)
                        gcFrame.method = sysbvm_type_lookupMacroSelector(context, gcFrame.receiverType, context->roots.doesNotUnderstandSelector);
                    if(!gcFrame.method)
                        gcFrame.method = sysbvm_type_lookupSelector(context, gcFrame.receiverType, context->roots.doesNotUnderstandSelector);
                    if(!gcFrame.method)
                        gcFrame.method = sysbvm_type_lookupFallbackSelector(context, gcFrame.receiverType, context->roots.doesNotUnderstandSelector);

                    if(!sysbvm_function_isMacro(context, gcFrame.method))
                        gcFrame.method = SYSBVM_NULL_TUPLE;
                    isDoesNotUnderstand = gcFrame.method != SYSBVM_NULL_TUPLE;
                }
            }
        }
        else
        {
            gcFrame.analyzedSelector = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.sendNode->selector, context->roots.symbolType, *environment);
            gcFrame.sendNode->selector = gcFrame.analyzedSelector;
            if(sysbvm_astNode_isLiteralNode(context, gcFrame.sendNode->selector))
            {
                gcFrame.selector = sysbvm_astLiteralNode_getValue(gcFrame.sendNode->selector);
                gcFrame.method = sysbvm_type_lookupMacroSelector(context, context->roots.anyValueType, gcFrame.selector);
            }
        }
    }
    else
    {
        gcFrame.analyzedSelector = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.sendNode->selector, context->roots.symbolType, *environment);
        gcFrame.sendNode->selector = gcFrame.analyzedSelector;
    }

    // Does not understand: 
    if(isDoesNotUnderstand && sysbvm_function_isMacro(context, gcFrame.method))
    {
        // Clear the analyzer token.
        gcFrame.macroContext = sysbvm_macroContext_create(context, *node, gcFrame.sendNode->super.sourcePosition, *environment);
        gcFrame.expansionResult = sysbvm_function_apply3(context, gcFrame.method, gcFrame.macroContext, gcFrame.sendNode->receiver, (sysbvm_tuple_t)gcFrame.sendNode);
        SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);

        // Analyze and evaluate the resulting node.
        return sysbvm_interpreter_analyzeASTWithCurrentExpectedTypeWithEnvironment(context, gcFrame.expansionResult, *environment);
    }

    // Turn this node onto an unexpanded application.
    bool hasExplicitSolvedLookupType = sysbvm_astNode_isLiteralNode(context, gcFrame.sendNode->receiverLookupType);
    if(gcFrame.method && (hasExplicitSolvedLookupType || sysbvm_function_shouldOptimizeLookup(context, gcFrame.method, gcFrame.methodOwner, sysbvm_astNode_isLiteralNode(context, gcFrame.sendNode->receiver))))
    {
        size_t applicationArgumentCount = sysbvm_array_getSize(gcFrame.sendNode->arguments);
        gcFrame.newMethodNode = sysbvm_astLiteralNode_create(context, gcFrame.sendNode->super.sourcePosition, gcFrame.method);

        gcFrame.newArgumentNodes = sysbvm_array_create(context, 1 + applicationArgumentCount);
        sysbvm_array_atPut(gcFrame.newArgumentNodes, 0, gcFrame.sendNode->receiver);
        for(size_t i = 0; i < applicationArgumentCount; ++i)
            sysbvm_array_atPut(gcFrame.newArgumentNodes, i + 1, sysbvm_array_at(gcFrame.sendNode->arguments, i));

        gcFrame.unexpandedApplicationNode = sysbvm_astUnexpandedApplicationNode_create(context, gcFrame.sendNode->super.sourcePosition, gcFrame.newMethodNode, gcFrame.newArgumentNodes);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return sysbvm_interpreter_analyzeASTWithCurrentExpectedTypeWithEnvironment(context, gcFrame.unexpandedApplicationNode, *environment);
    }

    if(gcFrame.method)
    {
        gcFrame.sendNode->boundMethod = gcFrame.method;
        gcFrame.sendNode->boundMethodOwner = gcFrame.methodOwner;
        gcFrame.methodType = sysbvm_tuple_getType(context, gcFrame.method);

        gcFrame.analysisFunction = sysbvm_type_getAnalyzeAndTypeCheckMessageSendNodeWithEnvironment(context, sysbvm_tuple_getType(context, gcFrame.methodType));
        if(gcFrame.analysisFunction)
        {
            SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
            return sysbvm_function_apply3(context, gcFrame.analysisFunction, gcFrame.methodType, (sysbvm_tuple_t)gcFrame.sendNode, *environment);
        }
    }
    else
    {
        if(!sysbvm_tuple_boolean_decode(gcFrame.sendNode->isDynamic) && !sysbvm_type_isDynamic(sysbvm_type_decay(context, gcFrame.receiverType)))
            sysbvm_error("Cannot send undeclared message to receiver without a dynamic type.");
    }

    gcFrame.analyzedReceiver = sysbvm_interpreter_analyzeASTWithDecayedTypeWithEnvironment(context, gcFrame.analyzedReceiver, *environment);
    gcFrame.sendNode->receiver = gcFrame.analyzedReceiver;

    size_t applicationArgumentCount = sysbvm_array_getSize(gcFrame.sendNode->arguments);
    gcFrame.analyzedArguments = sysbvm_array_create(context, applicationArgumentCount);
    for(size_t i = 0; i < applicationArgumentCount; ++i)
    {
        gcFrame.argumentNode = sysbvm_array_at(gcFrame.sendNode->arguments, i);
        gcFrame.analyzedArgumentNode = sysbvm_interpreter_analyzeASTWithDecayedTypeWithEnvironment(context, gcFrame.argumentNode, *environment);
        sysbvm_array_atPut(gcFrame.analyzedArguments, i, gcFrame.analyzedArgumentNode);
    }

    gcFrame.sendNode->arguments = gcFrame.analyzedArguments;
    gcFrame.sendNode->super.analyzedType = context->roots.anyValueType;
    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return (sysbvm_tuple_t)gcFrame.sendNode;
}